

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O3

int GetLatestData2MT(MT *pMT,MTDATA *pMTData)

{
  ushort uVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ushort uVar9;
  MTDATA *pValue;
  int iVar10;
  int OutputSettings;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uchar databuf [2048];
  int local_97c;
  double local_978;
  double local_960;
  double *local_958;
  double local_950;
  double local_948;
  MT *local_940;
  double *local_938;
  double *local_930;
  double *local_928;
  double *local_920;
  double *local_918;
  double *local_910;
  double *local_908;
  double *local_900;
  double *local_8f8;
  double *local_8f0;
  double *local_8e8;
  double *local_8e0;
  double *local_8d8;
  double *local_8d0;
  double *local_8c8;
  MTDATA *local_8c0;
  double *local_8b8;
  double *local_8b0;
  MTDATA *local_8a8;
  double *local_8a0;
  double *local_898;
  MTDATA *local_890;
  double *local_888;
  double *local_880;
  MTDATA *local_878;
  double *local_870;
  MTDATA *local_868;
  MTDATA *local_860;
  double *local_858;
  double *local_850;
  double local_848;
  ushort local_838;
  byte abStack_836 [3];
  ushort auStack_833 [2];
  uchar auStack_82f [2047];
  
  memset(&local_838,0,0x800);
  local_97c = 0;
  iVar6 = GetLatestMTMessageMT(pMT,0xff,0x36,(uchar *)&local_838,0x800,&local_97c);
  iVar7 = 1;
  if (iVar6 == 0) {
    iVar6 = 0;
    memset(pMTData,0,0x130);
    if (local_97c < 3) {
      puts("Error reading data from a MT : Empty MTDATA2 message. ");
    }
    else {
      local_850 = &pMTData->Vel_X;
      local_858 = &pMTData->Vel_Y;
      local_860 = (MTDATA *)&pMTData->Vel_Z;
      local_868 = (MTDATA *)&pMTData->Alt;
      local_870 = &pMTData->Lat;
      local_878 = (MTDATA *)&pMTData->Long;
      local_880 = &pMTData->magX;
      local_888 = &pMTData->magY;
      local_890 = (MTDATA *)&pMTData->magZ;
      local_898 = &pMTData->gyrX;
      local_8a0 = &pMTData->gyrY;
      local_8a8 = (MTDATA *)&pMTData->gyrZ;
      local_8b0 = &pMTData->accX;
      local_8b8 = &pMTData->accY;
      local_8c0 = (MTDATA *)&pMTData->accZ;
      local_8c8 = &pMTData->a;
      local_8d0 = &pMTData->b;
      local_958 = &pMTData->c;
      local_8d8 = &pMTData->d;
      local_8e0 = &pMTData->e;
      local_8e8 = &pMTData->f;
      local_8f0 = &pMTData->g;
      local_8f8 = &pMTData->h;
      local_900 = &pMTData->i;
      local_908 = &pMTData->roll;
      local_910 = &pMTData->pitch;
      local_918 = &pMTData->yaw;
      local_920 = &pMTData->q0;
      local_928 = &pMTData->q1;
      local_930 = &pMTData->q2;
      local_938 = &pMTData->q3;
      iVar7 = 3;
      do {
        pdVar5 = local_920;
        lVar8 = (long)iVar6;
        iVar10 = (uint)*(byte *)((long)&local_838 + lVar8 + 2) + iVar7;
        if (local_97c < iVar10) {
          puts("Error reading data from a MT : Bad packet. ");
          return 1;
        }
        uVar9 = *(ushort *)((long)&local_838 + lVar8) << 8;
        uVar1 = *(ushort *)((long)&local_838 + lVar8) >> 8;
        OutputSettings = (uint)(uVar9 | uVar1) * 4;
        uVar9 = uVar9 | uVar1 & 0xfff0;
        if (uVar9 < 0x5020) {
          if (uVar9 < 0x2010) {
            pValue = pMTData;
            if (uVar9 == 0x810) goto LAB_001b9d22;
            if (uVar9 == 0x1010) {
              uVar9 = *(ushort *)((long)&local_838 + lVar8 + 5);
              (pMTData->UTCTime).Nanoseconds =
                   CONCAT13(*(undefined1 *)((long)&local_838 + (long)iVar7),
                            CONCAT12(*(undefined1 *)((long)&local_838 + lVar8 + 4),
                                     uVar9 << 8 | uVar9 >> 8));
              uVar9 = *(ushort *)((long)&local_838 + lVar8 + 7);
              (pMTData->UTCTime).Year = uVar9 << 8 | uVar9 >> 8;
              (pMTData->UTCTime).Month = *(uchar *)((long)&local_838 + lVar8 + 9);
              (pMTData->UTCTime).Day = *(uchar *)((long)&local_838 + lVar8 + 10);
              (pMTData->UTCTime).Hour = *(uchar *)((long)&local_838 + lVar8 + 0xb);
              (pMTData->UTCTime).Minute = *(uchar *)((long)&local_838 + lVar8 + 0xc);
              (pMTData->UTCTime).Seconds = *(uchar *)((long)&local_838 + lVar8 + 0xd);
              (pMTData->UTCTime).Valid = *(uchar *)((long)&local_838 + lVar8 + 0xe);
              iVar10 = iVar6 + 0xf;
            }
            else if (uVar9 == 0x1020) {
              pMTData->TS = CONCAT11(*(undefined1 *)((long)&local_838 + (long)iVar7),
                                     *(undefined1 *)((long)&local_838 + lVar8 + 4));
              iVar10 = iVar6 + 5;
            }
          }
          else if (uVar9 < 0x2030) {
            if (uVar9 == 0x2010) {
              local_940 = pMT;
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar7,local_920);
              pdVar4 = local_928;
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_928);
              pdVar3 = local_930;
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_930);
              pdVar2 = local_938;
              iVar10 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_938);
              dVar14 = *pdVar5;
              dVar13 = *pdVar4;
              dVar11 = *pdVar3;
              local_960 = *pdVar2;
              dVar12 = dVar14 + dVar14;
              local_948 = dVar14 * dVar14 + dVar14 * dVar14;
              local_848 = atan2((dVar11 + dVar11) * local_960 + dVar12 * dVar13,
                                local_960 * local_960 + local_960 * local_960 + local_948 + -1.0);
              local_950 = dVar13 + dVar13;
              dVar15 = local_950 * local_960 - dVar11 * dVar12;
              dVar14 = -1.0;
              if ((-1.0 <= dVar15) && (dVar14 = 1.0, dVar15 <= 1.0)) {
                dVar14 = dVar15;
              }
              local_978 = asin(dVar14);
              dVar13 = atan2(local_950 * dVar11 + dVar12 * local_960,
                             local_948 + dVar13 * dVar13 + dVar13 * dVar13 + -1.0);
              pMT = local_940;
              auVar17._0_8_ = local_848 * 180.0;
              auVar17._8_8_ = local_978 * -180.0;
              auVar17 = divpd(auVar17,_DAT_001cc5a0);
              pMTData->roll = (double)auVar17._0_8_;
              pMTData->pitch = (double)auVar17._8_8_;
              pMTData->yaw = (dVar13 * 180.0) / 3.141592653589793;
              dVar11 = local_940->rollorientation + local_848;
              dVar14 = local_940->rollp1;
              dVar12 = cos(local_848 + local_940->rollp2);
              dVar14 = fmod(dVar12 * dVar14 + dVar11,6.283185307179586);
              dVar14 = fmod(dVar14 + 9.42477796076938,6.283185307179586);
              pMTData->Roll = dVar14 + -3.141592653589793;
              dVar14 = pMT->pitchp1;
              dVar11 = pMT->pitchorientation - local_978;
              dVar12 = cos(pMT->pitchp2 - local_978);
              dVar14 = fmod(dVar12 * dVar14 + dVar11,6.283185307179586);
              dVar14 = fmod(dVar14 + 9.42477796076938,6.283185307179586);
              pMTData->Pitch = dVar14 + -3.141592653589793;
              local_978 = pMT->yaworientation + dVar13;
              dVar14 = pMT->yawp1;
              dVar13 = cos(dVar13 + pMT->yawp2);
              dVar14 = fmod(dVar13 * dVar14 + local_978,6.283185307179586);
              dVar14 = fmod(dVar14 + 9.42477796076938,6.283185307179586);
              pMTData->Yaw = dVar14 + -3.141592653589793;
            }
            else if (uVar9 == 0x2020) {
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar7,local_8c8);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8d0);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_958);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8d8);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8e0);
              pdVar2 = local_8e8;
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8e8);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8f0);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8f8);
              pdVar5 = local_900;
              iVar10 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_900);
              dVar11 = atan2(*pdVar2,*pdVar5);
              dVar14 = *local_958;
              dVar13 = -1.0;
              if ((-1.0 <= dVar14) && (dVar13 = 1.0, dVar14 <= 1.0)) {
                dVar13 = dVar14;
              }
              dVar12 = asin(dVar13);
              local_978 = atan2(pMTData->b,pMTData->a);
              auVar16._0_8_ = dVar11 * 180.0;
              auVar16._8_8_ = dVar12 * -180.0;
              auVar17 = divpd(auVar16,_DAT_001cc5a0);
              pMTData->roll = (double)auVar17._0_8_;
              pMTData->pitch = (double)auVar17._8_8_;
              pMTData->yaw = (local_978 * 180.0) / 3.141592653589793;
              dVar14 = pMT->rollorientation;
              local_960 = pMT->rollp1;
              dVar13 = cos(dVar11 + pMT->rollp2);
              dVar14 = fmod(dVar13 * local_960 + dVar14 + dVar11,6.283185307179586);
              dVar14 = fmod(dVar14 + 9.42477796076938,6.283185307179586);
              pMTData->Roll = dVar14 + -3.141592653589793;
              dVar14 = pMT->pitchorientation;
              dVar13 = pMT->pitchp1;
              dVar11 = cos(pMT->pitchp2 - dVar12);
              dVar14 = fmod(dVar11 * dVar13 + (dVar14 - dVar12),6.283185307179586);
              dVar14 = fmod(dVar14 + 9.42477796076938,6.283185307179586);
              pMTData->Pitch = dVar14 + -3.141592653589793;
              dVar14 = pMT->yaworientation + local_978;
              dVar13 = pMT->yawp1;
              dVar11 = cos(local_978 + pMT->yawp2);
              dVar14 = dVar11 * dVar13 + dVar14;
              goto LAB_001b9ba7;
            }
          }
          else if (uVar9 == 0x2030) {
            iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar7,local_908);
            iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_910);
            iVar10 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_918);
            dVar11 = (pMTData->roll * 3.141592653589793) / 180.0;
            local_978 = (pMTData->pitch * 3.141592653589793) / 180.0;
            dVar15 = (pMTData->yaw * 3.141592653589793) / 180.0;
            dVar14 = pMT->rollorientation;
            dVar13 = pMT->rollp1;
            dVar12 = cos(dVar11 + pMT->rollp2);
            dVar14 = fmod(dVar12 * dVar13 + dVar14 + dVar11,6.283185307179586);
            dVar14 = fmod(dVar14 + 9.42477796076938,6.283185307179586);
            pMTData->Roll = dVar14 + -3.141592653589793;
            dVar11 = pMT->pitchorientation + local_978;
            dVar14 = pMT->pitchp1;
            dVar13 = cos(local_978 + pMT->pitchp2);
            dVar14 = fmod(dVar13 * dVar14 + dVar11,6.283185307179586);
            dVar14 = fmod(dVar14 + 9.42477796076938,6.283185307179586);
            pMTData->Pitch = dVar14 + -3.141592653589793;
            local_978 = pMT->yaworientation + dVar15;
            dVar14 = pMT->yawp1;
            dVar13 = cos(dVar15 + pMT->yawp2);
            dVar14 = dVar13 * dVar14 + local_978;
LAB_001b9ba7:
            dVar14 = fmod(dVar14,6.283185307179586);
            dVar14 = fmod(dVar14 + 9.42477796076938,6.283185307179586);
            pMTData->Yaw = dVar14 + -3.141592653589793;
          }
          else if (uVar9 == 0x4020) {
            iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar7,local_8b0);
            iVar7 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8b8);
            pValue = local_8c0;
            goto LAB_001b9d22;
          }
        }
        else if (uVar9 < 0xb020) {
          if (uVar9 < 0x8020) {
            pValue = local_868;
            if (uVar9 != 0x5020) {
              if (uVar9 != 0x5040) goto LAB_001b9d2a;
              iVar7 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar7,local_870);
              pValue = local_878;
            }
          }
          else {
            if (uVar9 != 0x8020) {
              if (uVar9 == 0xb010) {
                pMTData->Ain_1 =
                     CONCAT11(*(undefined1 *)((long)&local_838 + (long)iVar7),
                              *(undefined1 *)((long)&local_838 + lVar8 + 4));
                goto LAB_001b9c9a;
              }
              goto LAB_001b9d2a;
            }
            iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar7,local_898);
            iVar7 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8a0);
            pValue = local_8a8;
          }
LAB_001b9d22:
          iVar10 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar7,&pValue->temp);
        }
        else if (uVar9 < 0xd010) {
          if (uVar9 == 0xb020) {
            pMTData->Ain_2 =
                 CONCAT11(*(undefined1 *)((long)&local_838 + (long)iVar7),
                          *(undefined1 *)((long)&local_838 + lVar8 + 4));
LAB_001b9c9a:
            iVar10 = iVar6 + 5;
          }
          else if (uVar9 == 0xc020) {
            iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar7,local_880);
            iVar7 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_888);
            pValue = local_890;
            goto LAB_001b9d22;
          }
        }
        else {
          if (uVar9 == 0xd010) {
            iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar7,local_850);
            iVar7 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_858);
            pValue = local_860;
            goto LAB_001b9d22;
          }
          if (uVar9 == 0xe010) {
            pMTData->Status = *(uchar *)((long)&local_838 + (long)iVar7);
            iVar10 = iVar6 + 4;
          }
        }
LAB_001b9d2a:
        iVar6 = iVar10;
        iVar7 = iVar6 + 3;
      } while (iVar7 <= local_97c);
      memcpy(&pMT->LastMTData,pMTData,0x130);
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

inline int GetLatestData2MT(MT* pMT, MTDATA* pMTData)
{
	unsigned char databuf[MAX_NB_BYTES_MT];
	int nbdatabytes = 0;
	int offset = 0;
	int dataidentifier = 0;
	int size = 0;
	int precisionoutputsettings = 0;
	uShort_MT us;
	uInt_MT ul;
	double roll = 0, pitch = 0, yaw = 0;

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, MTDATA2_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		return EXIT_FAILURE;	
	}

	// Analyze data.

	memset(pMTData, 0, sizeof(MTDATA));

	if (nbdatabytes < 3) 
	{
		printf("Error reading data from a MT : Empty MTDATA2 message. \n");
		return EXIT_FAILURE;
	}

	// Might not be good if all data are not at the same output frequency...?

	while (nbdatabytes >= offset+3) 
	{
		// Get Data Identifier and Size of the packet.
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		dataidentifier = us.v;
		size = databuf[2+offset];
		offset += 3;
		if (nbdatabytes < offset+size) 
		{
			printf("Error reading data from a MT : Bad packet. \n");
			return EXIT_FAILURE;
		}
		precisionoutputsettings = (dataidentifier<<2);
		switch (dataidentifier & XDI_FullTypeMask)
		{
		case XDI_Temperature:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->temp);
			break;
		case XDI_UtcTime:
			ul.c[0] = databuf[3+offset];
			ul.c[1] = databuf[2+offset];
			ul.c[2] = databuf[1+offset];
			ul.c[3] = databuf[0+offset];
			pMTData->UTCTime.Nanoseconds = ul.v;
			offset += 4;
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->UTCTime.Year = us.v;
			offset += 2;
			pMTData->UTCTime.Month = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Day = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Hour = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Minute = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Seconds = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Valid = databuf[offset];
			offset += 1;
			break;
		case XDI_PacketCounter:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->TS = us.v;
			offset += 2;
			break;
		case XDI_Quaternion:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q0);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q1);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q2);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q3);
			quaternion2euler(pMTData->q0, pMTData->q1, pMTData->q2, pMTData->q3, &roll, &pitch, &yaw);
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;

			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_EulerAngles:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->roll);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->pitch);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->yaw);
			roll = pMTData->roll*M_PI/180.0;
			pitch = pMTData->pitch*M_PI/180.0;
			yaw = pMTData->yaw*M_PI/180.0;
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
	
			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_RotationMatrix:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->a);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->b);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->c);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->d);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->e);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->f);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->g);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->h);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->i);
			roll = atan2(pMTData->f,pMTData->i);
			pitch = -asin(constrain(pMTData->c, -1, 1)); // Attempt to avoid potential NAN...
			yaw = atan2(pMTData->b,pMTData->a);
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
		
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;

			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_Acceleration:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accZ);
			break;
		case XDI_RateOfTurn:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrZ);
			break;
		case XDI_MagneticField:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magZ);
			break;
		case XDI_StatusByte:
			pMTData->Status = databuf[offset];
			offset += 1;
			break;
		case XDI_AnalogIn1:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_1 = us.v;
			offset += 2;
			break;
		case XDI_AnalogIn2:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_2 = us.v;
			offset += 2;
			break;
		case XDI_LatLon:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Lat);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Long);
			break;
		case XDI_AltitudeEllipsoid:
			// Altitude Mean Sea Level or WGS84 in MTDATA message?
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Alt);
			break;
		case XDI_VelocityXYZ:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_X);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_Y);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_Z);
			break;
		default:
			// Skipping an unknown packet...
			offset += size;
			break;
		}
	}

	pMT->LastMTData = *pMTData;

	return EXIT_SUCCESS;
}